

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.h
# Opt level: O0

int dmrC_bb_terminated(basic_block *bb)

{
  instruction *piVar1;
  bool local_21;
  instruction *insn;
  basic_block *bb_local;
  
  if (bb == (basic_block *)0x0) {
    bb_local._4_4_ = 0;
  }
  else {
    piVar1 = dmrC_last_instruction(bb->insns);
    local_21 = false;
    if ((piVar1 != (instruction *)0x0) && (local_21 = false, 1 < (*(uint *)piVar1 & 0xff))) {
      local_21 = (*(uint *)piVar1 & 0xff) < 9;
    }
    bb_local._4_4_ = (uint)local_21;
  }
  return bb_local._4_4_;
}

Assistant:

static inline int dmrC_bb_terminated(struct basic_block *bb)
{
	struct instruction *insn;
	if (!bb)
		return 0;
	insn = dmrC_last_instruction(bb->insns);
	return insn && insn->opcode >= OP_TERMINATOR
	            && insn->opcode <= OP_TERMINATOR_END;
}